

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBooleanStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::BooleanStateQueryVerifiers::GetInteger64Verifier::verifyBoolean4
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,bool reference0,
          bool reference1,bool reference2,bool reference3)

{
  ostringstream *this_00;
  bool bVar1;
  StateQueryMemoryWriteGuard<long[4]> local_218;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_218.m_postguard[2] = -0x2121212121212122;
  local_218.m_postguard[3] = -0x2121212121212122;
  local_218.m_postguard[0] = -0x2121212121212122;
  local_218.m_postguard[1] = -0x2121212121212122;
  local_218.m_value[2] = 0xdededededededede;
  local_218.m_value[3] = 0xdededededededede;
  local_218.m_value[0] = 0xdededededededede;
  local_218.m_value[1] = 0xdededededededede;
  local_218.m_preguard[2] = -0x2121212121212122;
  local_218.m_preguard[3] = -0x2121212121212122;
  local_218.m_preguard[0] = -0x2121212121212122;
  local_218.m_preguard[1] = -0x2121212121212122;
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_218.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[4]>::verifyValidity
                    (&local_218,testCtx);
  if (bVar1) {
    if ((((local_218.m_value[0] != (ulong)reference0) || (local_218.m_value[1] != (ulong)reference1)
         ) || (local_218.m_value[2] != (ulong)reference2)) ||
       (local_218.m_value[3] != (ulong)reference3)) {
      local_1b0._0_8_ = testCtx->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"// ERROR: expected ",0x13);
      std::ostream::_M_insert<long>((long)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      std::ostream::_M_insert<long>((long)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      std::ostream::_M_insert<long>((long)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      std::ostream::_M_insert<long>((long)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
      }
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyBoolean4 (tcu::TestContext& testCtx, GLenum name, bool reference0, bool reference1, bool reference2, bool reference3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint64[4]> boolVector4;
	glGetInteger64v(name, boolVector4);

	if (!boolVector4.verifyValidity(testCtx))
		return;

	const GLint64 referenceAsGLint64[] =
	{
		reference0 ? 1 : 0,
		reference1 ? 1 : 0,
		reference2 ? 1 : 0,
		reference3 ? 1 : 0,
	};

	if (boolVector4[0] != referenceAsGLint64[0] ||
		boolVector4[1] != referenceAsGLint64[1] ||
		boolVector4[2] != referenceAsGLint64[2] ||
		boolVector4[3] != referenceAsGLint64[3])
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< referenceAsGLint64[0] << " "
			<< referenceAsGLint64[1] << " "
			<< referenceAsGLint64[2] << " "
			<< referenceAsGLint64[3] << " " << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}